

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

int __thiscall Sudoku::smazat(Sudoku *this,int x,int y)

{
  byte bVar1;
  int iVar2;
  sudoku_policko sVar3;
  int iVar4;
  uint y_00;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  Sudoku temp;
  Sudoku local_1ec;
  
  sVar3 = (this->s).pole[y * 9 + x];
  iVar5 = 0;
  if (((uint)sVar3 & 0x10) == 0 && ((uint)sVar3 & 0xf) != 0) {
    uVar7 = 0;
    memset(&local_1ec,0,0x1bc);
    iVar5 = 0;
    do {
      uVar6 = (uint)uVar7;
      iVar2 = (int)((uVar7 & 0xffffffff) / 9);
      y_00 = (uVar6 & 0xff) / 9;
      if ((y_00 != y) || (iVar4 = 1, x + iVar2 * 9 != uVar6)) {
        bVar1 = *(byte *)((this->s).pole + uVar7);
        iVar4 = iVar5;
        if ((bVar1 & 0xf) != 0) {
          doplnM(&local_1ec,iVar2 * -9 + uVar6,y_00,bVar1 & 0xf);
          *(byte *)(local_1ec.s.pole + uVar7) =
               *(byte *)(local_1ec.s.pole + uVar7) & 0xef | bVar1 & 0x10;
        }
      }
      iVar5 = iVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x51);
    memcpy(this,&local_1ec,0x1bc);
  }
  return iVar5;
}

Assistant:

int Sudoku::smazat ( int x, int y )
{
  int u,v, smazano = false;
  if(!s.pole[y*9+x].zapsane || s.pole[y*9+x].pevne) // pokud na pozici nic neni nebo je tam pevne cislo, nic se nedeje
    return false;
  Sudoku temp (-1); // prazdne sudoku pro doplnovani
  // projdeme vse
  for (int i = 0;i < 81; i++)
  {
    // vynechavame pri kopirovani mazane policko
    if(i/9 == y && i%9 == x)
    {
      smazano = true;
      continue;
    }
    // nezapisujeme prazdna policka, doslo by k zaseknuti
    if (!s.pole[i].zapsane)
      continue;
    // doplnime zpet policko
    temp.doplnM (i%9, i/9, s.pole[i].zapsane);
    temp.s.pole[i].pevne = s.pole[i].pevne;
  }
  s = temp.s; // preneseni stavu do tohoto sudoku z docasneho
  return smazano;
}